

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

function_record *
pybind11::class_<anurbs::Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>_>::
get_function_record(handle h)

{
  bool bVar1;
  bool bVar2;
  PyObject **ppPVar3;
  function_record *local_70;
  PyTypeObject *local_58;
  handle local_38;
  capsule local_30;
  PyObject *local_28;
  PyObject *local_20;
  handle local_18;
  handle h_local;
  
  local_28 = h.m_ptr;
  local_18.m_ptr = h.m_ptr;
  local_20 = (PyObject *)detail::get_function(h);
  local_18 = (handle)local_20;
  bVar2 = handle::operator_cast_to_bool(&local_18);
  bVar1 = false;
  if (bVar2) {
    ppPVar3 = handle::ptr(&local_18);
    if ((*(uint *)((*ppPVar3)[1].ob_refcnt + 0x10) & 0x20) == 0) {
      ppPVar3 = handle::ptr(&local_18);
      local_58 = (*ppPVar3)[1].ob_type;
    }
    else {
      local_58 = (PyTypeObject *)0x0;
    }
    handle::handle(&local_38,(PyObject *)local_58);
    reinterpret_borrow<pybind11::capsule>((pybind11 *)&local_30,local_38);
    bVar1 = true;
    local_70 = capsule::operator_cast_to_function_record_(&local_30);
  }
  else {
    local_70 = (function_record *)0x0;
  }
  h_local.m_ptr = (PyObject *)local_70;
  if (bVar1) {
    capsule::~capsule(&local_30);
  }
  return (function_record *)h_local.m_ptr;
}

Assistant:

static detail::function_record *get_function_record(handle h) {
        h = detail::get_function(h);
        return h ? (detail::function_record *) reinterpret_borrow<capsule>(PyCFunction_GET_SELF(h.ptr()))
                 : nullptr;
    }